

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O0

HighsDomainChange __thiscall HighsDomain::backtrack(HighsDomain *this)

{
  bool bVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  const_iterator __first;
  HighsDomainChange HVar4;
  size_type sVar5;
  Reason RVar6;
  reference pvVar7;
  pointer pHVar8;
  reference pvVar9;
  reference pvVar10;
  reference pvVar11;
  int iVar12;
  HighsDomain *in_RDI;
  HighsInt i;
  HighsInt numreason;
  HighsInt prevpos;
  double prevbound;
  Reason old_reason;
  bool old_infeasible;
  HighsInt k;
  HighsDomainChange backtrackboundchg;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *this_00;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  Reason in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  HighsInt in_stack_ffffffffffffff4c;
  int local_70;
  int local_1c;
  double local_10;
  undefined4 local_8;
  HighsBoundType HStack_4;
  
  sVar5 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::size
                    (&in_RDI->domchgstack_);
  iVar12 = (int)sVar5;
  bVar1 = in_RDI->infeasible_;
  if ((in_RDI->infeasible_ & 1U) != 0) {
    in_stack_ffffffffffffff4c = in_RDI->infeasible_pos;
    sVar5 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::size
                      (&in_RDI->domchgstack_);
    if (in_stack_ffffffffffffff4c == (int)sVar5) {
      in_RDI->infeasible_ = false;
      RVar6 = Reason::unspecified();
      in_RDI->infeasible_reason = RVar6;
    }
  }
  do {
    local_70 = iVar12;
    local_1c = local_70 + -1;
    if (local_1c < 0) goto LAB_005c8f61;
    std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::operator[]
              (&in_RDI->prevboundval_,(long)local_1c);
    pvVar7 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::
             operator[](&in_RDI->prevboundval_,(long)local_1c);
    iVar12 = pvVar7->second;
    pHVar8 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x5c8d90);
    in_stack_ffffffffffffff40 = (Reason)&pHVar8->field_0x68b0;
    pvVar9 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                       (&in_RDI->domchgstack_,(long)local_1c);
    HighsDebugSol::boundChangeRemoved((HighsDebugSol *)in_stack_ffffffffffffff40,in_RDI,pvVar9);
    pvVar9 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                       (&in_RDI->domchgstack_,(long)local_1c);
    if (pvVar9->boundtype == kLower) {
      pvVar9 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                         (&in_RDI->domchgstack_,(long)local_1c);
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                          (&in_RDI->colLowerPos_,(long)pvVar9->column);
      *pvVar10 = iVar12;
      in_stack_ffffffffffffff3c = iVar12;
    }
    else {
      in_stack_ffffffffffffff20 = &in_RDI->colUpperPos_;
      pvVar9 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                         (&in_RDI->domchgstack_,(long)local_1c);
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                          (in_stack_ffffffffffffff20,(long)pvVar9->column);
      *pvVar10 = iVar12;
      in_stack_ffffffffffffff2c = iVar12;
    }
    std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
              (&in_RDI->domchgstack_,(long)local_1c);
    std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
              (&in_RDI->domchgstack_,(long)local_1c);
    doChangeBound((HighsDomain *)in_stack_ffffffffffffff40,
                  (HighsDomainChange *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)
                 );
    if (((in_RDI->infeasible_ & 1U) != 0) && (in_RDI->infeasible_pos == local_1c)) {
      in_RDI->infeasible_ = false;
      RVar6 = Reason::unspecified();
      in_RDI->infeasible_reason = RVar6;
    }
    pvVar11 = std::vector<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>::operator[]
                        (&in_RDI->domchgreason_,(long)local_1c);
    iVar12 = local_1c;
  } while (pvVar11->type != -1);
  std::vector<int,_std::allocator<int>_>::pop_back((vector<int,_std::allocator<int>_> *)0x5c8f49);
LAB_005c8f61:
  if ((bVar1 & 1U) != 0) {
    markPropagateCut((HighsDomain *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                     in_stack_ffffffffffffff40);
    RVar6 = Reason::unspecified();
    in_RDI->infeasible_reason = RVar6;
    in_RDI->infeasible_ = false;
  }
  sVar5 = std::vector<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>::size
                    (&in_RDI->domchgreason_);
  for (; local_70 < (int)sVar5; local_70 = local_70 + 1) {
    std::vector<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>::operator[]
              (&in_RDI->domchgreason_,(long)local_70);
    markPropagateCut((HighsDomain *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                     in_stack_ffffffffffffff40);
  }
  if (local_1c < 0) {
    std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::clear
              ((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)0x5c9031);
    std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::clear
              ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)0x5c903f)
    ;
    std::vector<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>::clear
              ((vector<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_> *)0x5c904d);
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x5c905e);
    local_10 = 0.0;
    local_8 = 0xffffffff;
    HStack_4 = kLower;
  }
  else {
    pvVar9 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                       (&in_RDI->domchgstack_,(long)local_1c);
    local_10 = pvVar9->boundval;
    uVar2 = pvVar9->column;
    uVar3 = pvVar9->boundtype;
    this_00 = &in_RDI->domchgstack_;
    std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::begin(this_00);
    __gnu_cxx::
    __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
    ::operator+((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                 *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                (difference_type)in_stack_ffffffffffffff20);
    __gnu_cxx::
    __normal_iterator<HighsDomainChange_const*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>
    ::__normal_iterator<HighsDomainChange*>
              ((__normal_iterator<const_HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                *)in_stack_ffffffffffffff20,
               (__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                *)this_00);
    std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::end(this_00);
    __gnu_cxx::
    __normal_iterator<HighsDomainChange_const*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>
    ::__normal_iterator<HighsDomainChange*>
              ((__normal_iterator<const_HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                *)in_stack_ffffffffffffff20,
               (__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                *)this_00);
    __first._M_current._4_4_ = in_stack_ffffffffffffff4c;
    __first._M_current._0_4_ = in_stack_ffffffffffffff48;
    std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::erase
              ((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)
               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),__first,
               (const_iterator)in_stack_ffffffffffffff40);
    std::vector<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>::resize
              ((vector<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_> *)
               in_stack_ffffffffffffff40,
               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::resize
              ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
               in_stack_ffffffffffffff40,
               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    local_8 = uVar2;
    HStack_4 = uVar3;
  }
  HVar4.column = local_8;
  HVar4.boundval = local_10;
  HVar4.boundtype = HStack_4;
  return HVar4;
}

Assistant:

HighsDomainChange HighsDomain::backtrack() {
  HighsInt k = HighsInt(domchgstack_.size()) - 1;
  bool old_infeasible = infeasible_;
  Reason old_reason = infeasible_reason;

  if (infeasible_ && infeasible_pos == HighsInt(domchgstack_.size())) {
    assert(old_infeasible);
    assert(k == HighsInt(domchgstack_.size()) - 1);
    infeasible_ = false;
    infeasible_reason = Reason::unspecified();
  }
  while (k >= 0) {
    double prevbound = prevboundval_[k].first;
    HighsInt prevpos = prevboundval_[k].second;
    assert(prevpos < k);

    mipsolver->mipdata_->debugSolution.boundChangeRemoved(*this,
                                                          domchgstack_[k]);

    if (domchgstack_[k].boundtype == HighsBoundType::kLower) {
      assert(colLowerPos_[domchgstack_[k].column] == k);
      colLowerPos_[domchgstack_[k].column] = prevpos;
    } else {
      assert(colUpperPos_[domchgstack_[k].column] == k);
      colUpperPos_[domchgstack_[k].column] = prevpos;
    }

    // change back to global bound
    doChangeBound(
        {prevbound, domchgstack_[k].column, domchgstack_[k].boundtype});

    if (infeasible_ && infeasible_pos == k) {
      assert(old_infeasible);
      assert(k == HighsInt(domchgstack_.size()) - 1);
      infeasible_ = false;
      infeasible_reason = Reason::unspecified();
    }

    if (domchgreason_[k].type == Reason::kBranching) {
      branchPos_.pop_back();
      break;
    }

    --k;
  }

  if (old_infeasible) {
    markPropagateCut(old_reason);
    infeasible_reason = Reason::unspecified();
    infeasible_ = false;
  }

  HighsInt numreason = domchgreason_.size();
  for (HighsInt i = k + 1; i < numreason; ++i)
    markPropagateCut(domchgreason_[i]);

  if (k < 0) {
    domchgstack_.clear();
    prevboundval_.clear();
    domchgreason_.clear();
    branchPos_.clear();
    return HighsDomainChange({0.0, -1, HighsBoundType::kLower});
  }

  HighsDomainChange backtrackboundchg = domchgstack_[k];
  domchgstack_.erase(domchgstack_.begin() + k, domchgstack_.end());
  domchgreason_.resize(k);
  prevboundval_.resize(k);

  return backtrackboundchg;
}